

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

RandomUniformLikeLayerParams * __thiscall
CoreML::Specification::RandomUniformLikeLayerParams::New
          (RandomUniformLikeLayerParams *this,Arena *arena)

{
  RandomUniformLikeLayerParams *this_00;
  RandomUniformLikeLayerParams *n;
  Arena *arena_local;
  RandomUniformLikeLayerParams *this_local;
  
  this_00 = (RandomUniformLikeLayerParams *)operator_new(0x28);
  RandomUniformLikeLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RandomUniformLikeLayerParams>(arena,this_00)
    ;
  }
  return this_00;
}

Assistant:

RandomUniformLikeLayerParams* RandomUniformLikeLayerParams::New(::google::protobuf::Arena* arena) const {
  RandomUniformLikeLayerParams* n = new RandomUniformLikeLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}